

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O3

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true>::
pick_card_messaging_group
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true> *this,Card *card)

{
  int iVar1;
  __normal_iterator<Apple::II::Card_**,_std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>_>
  _Var2;
  vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_> *pvVar3;
  
  iVar1 = card->select_constraints_;
  pvVar3 = &this->every_cycle_cards_;
  if (iVar1 != 0) {
    pvVar3 = &this->just_in_time_cards_;
  }
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<Apple::II::Card**,std::vector<Apple::II::Card*,std::allocator<Apple::II::Card*>>>,__gnu_cxx::__ops::_Iter_equals_val<Apple::II::Card*const>>
                    ((pvVar3->
                     super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>).
                     _M_impl.super__Vector_impl_data._M_start,
                     (pvVar3->
                     super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>).
                     _M_impl.super__Vector_impl_data._M_finish);
  if (_Var2._M_current ==
      (pvVar3->super__Vector_base<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    this->card_lists_are_dirty_ = true;
    this->card_became_just_in_time_ = (bool)(this->card_became_just_in_time_ | iVar1 != 0);
  }
  return;
}

Assistant:

void pick_card_messaging_group(Apple::II::Card *card) {
			// Simplify to a card being either just-in-time or realtime.
			// Don't worry about exactly what it's watching,
			const bool is_every_cycle = is_every_cycle_card(card);
			std::vector<Apple::II::Card *> &intended = is_every_cycle ? every_cycle_cards_ : just_in_time_cards_;

			// If the card is already in the proper group, stop.
			if(std::find(intended.begin(), intended.end(), card) != intended.end()) return;

			// Otherwise, mark the sets as dirty. It isn't safe to transition the card here,
			// as the main loop may be part way through iterating the two lists.
			card_lists_are_dirty_ = true;
			card_became_just_in_time_ |= !is_every_cycle;
		}